

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier_test.cpp
# Opt level: O0

void __thiscall license::test::print_and_read::test_method(print_and_read *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  LCC_API_HW_IDENTIFICATION_STRATEGY LVar3;
  ostream *this_00;
  lazy_ostream *plVar4;
  basic_cstring<const_char> local_138;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]> local_128;
  assertion_result local_108;
  basic_cstring<const_char> local_f0;
  basic_cstring<const_char> local_e0;
  basic_cstring<const_char> local_d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[27],_const_char_(&)[27]> local_c0;
  assertion_result local_a0;
  basic_cstring<const_char> local_88;
  basic_cstring<const_char> local_78;
  undefined1 local_68 [8];
  HwIdentifier id2;
  string pc_id_str;
  undefined1 local_28 [8];
  HwIdentifier pc_id;
  array<unsigned_char,_7UL> data;
  print_and_read *this_local;
  
  builtin_memcpy(pc_id.m_data._M_elems,"BBBBBBB",7);
  hw_identifier::HwIdentifier::HwIdentifier((HwIdentifier *)local_28);
  hw_identifier::HwIdentifier::set_data
            ((HwIdentifier *)local_28,(array<unsigned_char,_7UL> *)&pc_id.m_data);
  hw_identifier::HwIdentifier::set_identification_strategy
            ((HwIdentifier *)local_28,STRATEGY_ETHERNET);
  hw_identifier::HwIdentifier::print_abi_cxx11_((HwIdentifier *)&id2.m_data);
  this_00 = std::operator<<((ostream *)std::cout,(string *)&id2.m_data);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  hw_identifier::HwIdentifier::HwIdentifier((HwIdentifier *)local_68,(string *)&id2.m_data);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/hw_identifier/hw_identifier_test.cpp"
               ,0x8a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_88);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_78,0x3c,&local_88);
    LVar3 = hw_identifier::HwIdentifier::get_identification_strategy((HwIdentifier *)local_68);
    boost::test_tools::assertion_result::assertion_result(&local_a0,LVar3 == STRATEGY_ETHERNET);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c0,plVar4,(char (*) [27])"Strategy decoded correctly");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/hw_identifier/hw_identifier_test.cpp"
               ,0x8a);
    boost::test_tools::tt_detail::report_assertion(&local_a0,&local_c0,&local_d0,0x3c,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[27],_const_char_(&)[27]>::
    ~lazy_ostream_impl(&local_c0);
    boost::test_tools::assertion_result::~assertion_result(&local_a0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/hw_identifier/hw_identifier_test.cpp"
               ,0x8a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_e0,0x3d,&local_f0);
    bVar2 = hw_identifier::HwIdentifier::data_match
                      ((HwIdentifier *)local_68,(array<unsigned_char,_7UL> *)&pc_id.m_data);
    boost::test_tools::assertion_result::assertion_result(&local_108,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_128,plVar4,(char (*) [28])"Data deserialized correctly");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/hw_identifier/hw_identifier_test.cpp"
               ,0x8a);
    boost::test_tools::tt_detail::report_assertion(&local_108,&local_128,&local_138,0x3d,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]>::
    ~lazy_ostream_impl(&local_128);
    boost::test_tools::assertion_result::~assertion_result(&local_108);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  hw_identifier::HwIdentifier::~HwIdentifier((HwIdentifier *)local_68);
  std::__cxx11::string::~string((string *)&id2.m_data);
  hw_identifier::HwIdentifier::~HwIdentifier((HwIdentifier *)local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(print_and_read) {
	array<uint8_t, HW_IDENTIFIER_PROPRIETARY_DATA> data = {0x42, 0x42, 0x42, 0x42, 0x42, 0x42, 0x42};
	HwIdentifier pc_id;
	pc_id.set_data(data);
	pc_id.set_identification_strategy(LCC_API_HW_IDENTIFICATION_STRATEGY::STRATEGY_ETHERNET);
	string pc_id_str = pc_id.print();
	cout << pc_id_str << endl;
	const HwIdentifier id2(pc_id_str);
	BOOST_CHECK_MESSAGE(id2.get_identification_strategy() == LCC_API_HW_IDENTIFICATION_STRATEGY::STRATEGY_ETHERNET,
						"Strategy decoded correctly");
	BOOST_CHECK_MESSAGE(id2.data_match(data), "Data deserialized correctly");
}